

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

int __thiscall CConsole::ParseArgs(CConsole *this,CResult *pResult,char *pFormat)

{
  char cVar1;
  uint uVar2;
  bool bVar3;
  CConsole *pCVar4;
  bool bVar5;
  CConsole *str;
  CConsole *pCVar6;
  CConsole *pCVar7;
  uint uVar8;
  CConsole *str_00;
  long in_FS_OFFSET;
  char Command;
  byte local_41;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_41 = *pFormat;
  local_40 = pFormat;
  if (local_41 == 0) {
    uVar8 = 0;
LAB_0012b5bd:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return uVar8;
    }
    __stack_chk_fail();
  }
  uVar8 = 0;
  bVar3 = false;
  str_00 = (CConsole *)pResult->m_pArgsStart;
  do {
    if (local_41 == 0x3f) {
      bVar3 = true;
      str = str_00;
    }
    else {
      str = (CConsole *)str_skip_whitespaces((char *)str_00);
      cVar1 = *(char *)&(str->super_IConsole).super_IInterface._vptr_IInterface;
      if (cVar1 == '\"') {
        pCVar6 = (CConsole *)((long)&(str->super_IConsole).super_IInterface._vptr_IInterface + 1);
        uVar8 = (pResult->super_IResult).m_NumArgs;
        (pResult->super_IResult).m_NumArgs = uVar8 + 1;
        pResult->m_apArgs[uVar8] = (char *)pCVar6;
        cVar1 = *(char *)((long)&(str->super_IConsole).super_IInterface._vptr_IInterface + 1);
        pCVar4 = pCVar6;
        pCVar7 = str;
        while (str = pCVar4, cVar1 != '\"') {
          if (cVar1 == '\\') {
            pCVar7 = (CConsole *)
                     ((long)&(str->super_IConsole).super_IInterface._vptr_IInterface + 1);
            cVar1 = *(char *)((long)&(str->super_IConsole).super_IInterface._vptr_IInterface + 1);
            if ((cVar1 != '\"') && (cVar1 != '\\')) goto LAB_0012b526;
          }
          else {
            if (cVar1 == '\0') goto LAB_0012b54c;
LAB_0012b526:
            pCVar7 = str;
          }
          *(char *)&(pCVar6->super_IConsole).super_IInterface._vptr_IInterface =
               *(char *)&(pCVar7->super_IConsole).super_IInterface._vptr_IInterface;
          pCVar6 = (CConsole *)
                   ((long)&(pCVar6->super_IConsole).super_IInterface._vptr_IInterface + 1);
          pCVar4 = (CConsole *)
                   ((long)&(pCVar7->super_IConsole).super_IInterface._vptr_IInterface + 1);
          cVar1 = *(char *)((long)&(pCVar7->super_IConsole).super_IInterface._vptr_IInterface + 1);
        }
        *(char *)&(pCVar6->super_IConsole).super_IInterface._vptr_IInterface = '\0';
        str = (CConsole *)((long)&(pCVar7->super_IConsole).super_IInterface._vptr_IInterface + 2);
LAB_0012b54c:
        this = str_00;
        if (cVar1 != '\"') {
          uVar8 = 1;
          goto LAB_0012b5bd;
        }
      }
      else {
        if (cVar1 == '\0') {
          if (!bVar3) {
            uVar8 = 1;
          }
          goto LAB_0012b5bd;
        }
        uVar2 = (pResult->super_IResult).m_NumArgs;
        (pResult->super_IResult).m_NumArgs = uVar2 + 1;
        pResult->m_apArgs[uVar2] = (char *)str;
        if (local_41 < 0x72) {
          if ((local_41 == 0x66) || (local_41 == 0x69)) {
LAB_0012b558:
            pCVar7 = (CConsole *)str_skip_to_whitespace((char *)str);
            str_00 = str;
            str = pCVar7;
          }
        }
        else {
          if (local_41 == 0x73) goto LAB_0012b558;
          if (local_41 == 0x72) {
            str_utf8_trim_whitespaces_right((char *)str);
            goto LAB_0012b5bd;
          }
        }
        this = str_00;
        if (*(char *)&(str->super_IConsole).super_IInterface._vptr_IInterface != '\0') {
          *(char *)&(str->super_IConsole).super_IInterface._vptr_IInterface = '\0';
          str = (CConsole *)((long)&(str->super_IConsole).super_IInterface._vptr_IInterface + 1);
        }
      }
    }
    bVar5 = NextParam(this,(char *)&local_41,&local_40);
    uVar8 = (uint)bVar5;
    if ((bVar5) || (str_00 = str, local_41 == 0)) goto LAB_0012b5bd;
  } while( true );
}

Assistant:

int CConsole::ParseArgs(CResult *pResult, const char *pFormat)
{
	char Command = *pFormat;
	char *pStr;
	int Optional = 0;
	int Error = 0;

	pStr = pResult->m_pArgsStart;

	while(!Error)
	{
		if(!Command)
			break;

		if(Command == '?')
			Optional = 1;
		else
		{
			pStr = str_skip_whitespaces(pStr);

			if(!(*pStr)) // error, non optional command needs value
			{
				if(!Optional)
				{
					Error = 1;
				}
				break;
			}

			// add token
			if(*pStr == '"')
			{
				char *pDst;
				pStr++;
				pResult->AddArgument(pStr);

				pDst = pStr; // we might have to process escape data
				while(1)
				{
					if(pStr[0] == '"')
						break;
					else if(pStr[0] == '\\')
					{
						if(pStr[1] == '\\')
							pStr++; // skip due to escape
						else if(pStr[1] == '"')
							pStr++; // skip due to escape
					}
					else if(pStr[0] == 0)
						return 1; // return error

					*pDst = *pStr;
					pDst++;
					pStr++;
				}

				// write null termination
				*pDst = 0;


				pStr++;
			}
			else
			{
				pResult->AddArgument(pStr);

				if(Command == 'r') // rest of the string
				{
					str_utf8_trim_whitespaces_right(pStr);
					break;
				}
				else if(Command == 'i') // validate int
					pStr = str_skip_to_whitespace(pStr);
				else if(Command == 'f') // validate float
					pStr = str_skip_to_whitespace(pStr);
				else if(Command == 's') // validate string
					pStr = str_skip_to_whitespace(pStr);

				if(pStr[0] != 0) // check for end of string
				{
					pStr[0] = 0;
					pStr++;
				}
			}
		}

		// fetch next command
		Error = NextParam(&Command, pFormat);
	}

	return Error;
}